

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

void crnlib::LzmaEnc_FastPosInit(Byte *g_FastPos)

{
  uint local_20;
  UInt32 j;
  UInt32 k;
  int slotFast;
  int c;
  Byte *g_FastPos_local;
  
  k = 2;
  *g_FastPos = '\0';
  g_FastPos[1] = '\x01';
  for (j = 2; (int)j < 0x1a; j = j + 1) {
    for (local_20 = 0; local_20 < (uint)(1 << ((char)((int)j >> 1) - 1U & 0x1f));
        local_20 = local_20 + 1) {
      g_FastPos[(int)k] = (Byte)j;
      k = k + 1;
    }
  }
  return;
}

Assistant:

void LzmaEnc_FastPosInit(Byte* g_FastPos) {
  int c = 2, slotFast;
  g_FastPos[0] = 0;
  g_FastPos[1] = 1;

  for (slotFast = 2; slotFast < kNumLogBits * 2; slotFast++) {
    UInt32 k = (1 << ((slotFast >> 1) - 1));
    UInt32 j;
    for (j = 0; j < k; j++, c++)
      g_FastPos[c] = (Byte)slotFast;
  }
}